

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shaderprogram.cpp
# Opt level: O1

void __thiscall FShaderProgram::~FShaderProgram(FShaderProgram *this)

{
  int i;
  long lVar1;
  
  if (this->mProgram != 0) {
    (*_ptrc_glDeleteProgram)(this->mProgram);
  }
  lVar1 = 0;
  do {
    if (this->mShaders[lVar1] != 0) {
      (*_ptrc_glDeleteShader)(this->mShaders[lVar1]);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  return;
}

Assistant:

FShaderProgram::~FShaderProgram()
{
	if (mProgram != 0)
		glDeleteProgram(mProgram);

	for (int i = 0; i < NumShaderTypes; i++)
	{
		if (mShaders[i] != 0)
			glDeleteShader(mShaders[i]);
	}
}